

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

int os_tmpname(lua_State *L)

{
  int iVar1;
  char buff [32];
  
  builtin_strncpy(buff,"/tmp/lua_XXXXXX",0x10);
  iVar1 = mkstemp64(buff);
  if (iVar1 == -1) {
    iVar1 = luaL_error(L,"unable to generate a unique filename");
  }
  else {
    close(iVar1);
    lua_pushstring(L,buff);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int os_tmpname (lua_State *L) {
  char buff[LUA_TMPNAMBUFSIZE];
  int err;
  lua_tmpnam(buff, err);
  if (l_unlikely(err))
    return luaL_error(L, "unable to generate a unique filename");
  lua_pushstring(L, buff);
  return 1;
}